

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void SequentializeParallelCopies(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  VmBlock *block;
  VmInstruction *p;
  VmBlock **ppVVar1;
  VmInstruction **ppVVar2;
  
  ppVVar1 = &function->firstBlock;
  while (block = *ppVVar1, block != (VmBlock *)0x0) {
    ppVVar2 = &block->firstInstruction;
    while (p = *ppVVar2, p != (VmInstruction *)0x0) {
      if (p->cmd == VM_INST_PARALLEL_COPY) {
        module->currentBlock = block;
        block->insertPoint = p;
        SequentializeParallelCopy(module,p);
        module->currentBlock = (VmBlock *)0x0;
        block->insertPoint = block->lastInstruction;
      }
      ppVVar2 = &p->nextSibling;
    }
    RunDeadCodeElimiation(ctx,module,block);
    ppVVar1 = &block->nextSibling;
  }
  return;
}

Assistant:

void SequentializeParallelCopies(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	for(VmBlock *block = function->firstBlock; block; block = block->nextSibling)
	{
		for(VmInstruction *inst = block->firstInstruction; inst; inst = inst->nextSibling)
		{
			if(inst->cmd == VM_INST_PARALLEL_COPY)
			{
				module->currentBlock = block;
				block->insertPoint = inst;

				SequentializeParallelCopy(module, inst);

				module->currentBlock = NULL;
				block->insertPoint = block->lastInstruction;
			}
		}

		RunDeadCodeElimiation(ctx, module, block);
	}
}